

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamCoreRandom.hpp
# Opt level: O3

void TasDREAM::genGaussianSamples
               (vector<double,_std::allocator<double>_> *means,
               vector<double,_std::allocator<double>_> *deviations,int num_samples,
               vector<double,_std::allocator<double>_> *x,function<double_()> *get_random01)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  runtime_error *this;
  long lVar7;
  pointer pdVar8;
  size_type __new_size;
  pointer __s;
  double *pdVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  double local_38;
  
  lVar7 = (long)(means->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(means->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_40 = means;
  if (lVar7 != (long)(deviations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(deviations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start) {
LAB_0011336d:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,
               "ERROR: genGaussianSamples() means and deviations vectors must have the same size.");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __s = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_start;
  pdVar8 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  __new_size = (long)num_samples * (lVar7 >> 3);
  if ((long)pdVar8 - (long)__s >> 3 != __new_size) {
    std::vector<double,_std::allocator<double>_>::resize(x,__new_size);
    __s = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
          _M_start;
    pdVar8 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if (pdVar8 != __s) {
    memset(__s,0,((long)pdVar8 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
  }
  std::function<double_()>::function((function<double_()> *)&local_60,get_random01);
  pdVar9 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar1 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar9 != pdVar1) {
    bVar10 = false;
    dVar11 = 0.0;
    do {
      if (!bVar10) {
        if (local_50 != (code *)0x0) {
          dVar11 = (*local_48)(&local_60);
          dVar12 = log(dVar11);
          dVar12 = dVar12 * -2.0;
          if (dVar12 < 0.0) {
            dVar12 = sqrt(dVar12);
          }
          else {
            dVar12 = SQRT(dVar12);
          }
          if (local_50 != (code *)0x0) {
            local_38 = (*local_48)(&local_60);
            local_38 = local_38 * 6.283185307179586;
            dVar11 = cos(local_38);
            *pdVar9 = dVar11 * dVar12 + *pdVar9;
            dVar11 = sin(local_38);
            dVar11 = dVar11 * dVar12;
            goto LAB_001132dd;
          }
        }
        std::__throw_bad_function_call();
        goto LAB_0011336d;
      }
      *pdVar9 = *pdVar9 + dVar11;
LAB_001132dd:
      bVar10 = (bool)(bVar10 ^ 1);
      pdVar9 = pdVar9 + 1;
    } while (pdVar9 != pdVar1);
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  pdVar9 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar1 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar9 != pdVar1) {
    pdVar2 = (local_40->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (deviations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (deviations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar5 = pdVar2;
    pdVar6 = pdVar3;
    do {
      for (; pdVar6 != pdVar4; pdVar6 = pdVar6 + 1) {
        dVar11 = *pdVar6;
        dVar12 = *pdVar9;
        *pdVar9 = dVar11 * dVar12;
        *pdVar9 = dVar11 * dVar12 + *pdVar5;
        pdVar9 = pdVar9 + 1;
        pdVar5 = pdVar5 + 1;
      }
      pdVar5 = pdVar2;
      pdVar6 = pdVar3;
    } while (pdVar9 != pdVar1);
  }
  return;
}

Assistant:

inline void genGaussianSamples(const std::vector<double> &means, const std::vector<double> &deviations,
                               int num_samples, std::vector<double> &x, std::function<double(void)> get_random01 = tsgCoreUniform01){
    if (means.size() != deviations.size()) throw std::runtime_error("ERROR: genGaussianSamples() means and deviations vectors must have the same size.");
    if (x.size() != means.size() * num_samples) x.resize(means.size() * num_samples);

    std::fill_n(x.data(), x.size(), 0.0);
    applyGaussianUpdate(x, 1.0, get_random01);

    auto ix = x.begin();
    while(ix != x.end()){
        auto im = means.begin();
        for(auto s : deviations){
            *ix *= s;
            *ix++ += *im++;
        }
    }
}